

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepEdgeIntegrationPoints.h
# Opt level: O0

pair<std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
* anurbs::BrepEdgeIntegrationPoints::get
            (pair<std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
             *__return_storage_ptr__,BrepEdge *edge,double tolerance,double tessellation_tolerance)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  pointer *this_00;
  double dVar1;
  double dVar2;
  initializer_list<long> __l;
  bool bVar3;
  int iVar4;
  BrepTrim *pBVar5;
  element_type *peVar6;
  reference pIVar7;
  element_type *peVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar9;
  Index IVar10;
  size_type __n;
  reference pvVar11;
  reference __t;
  __tuple_element_t<0UL,_tuple<double,_double>_> *__args;
  __tuple_element_t<1UL,_tuple<double,_double>_> *p_Var12;
  const_reference pvVar13;
  double local_458;
  double t_a_1;
  double weight;
  value_type tangent;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ders;
  type *weight_b;
  type *t_b_1;
  __normal_iterator<const_std::tuple<double,_double>_*,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
  local_400;
  const_iterator __end3;
  const_iterator __begin3;
  IntegrationPointList<1> *__range3;
  IntegrationPointList<1> points;
  Interval span_b_1;
  value_type t1_b;
  value_type t0_b;
  Index i;
  long nb_integration_points;
  undefined8 local_398;
  undefined8 local_390;
  undefined8 local_388;
  iterator local_380;
  undefined8 local_378;
  size_t local_370;
  long degree;
  undefined1 local_358 [16];
  Ref<anurbs::NurbsSurfaceGeometry<3L>_> local_348;
  __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_338;
  Pointer<anurbs::NurbsSurfaceGeometry<3L>_> *surface_3d_b;
  undefined1 local_320 [16];
  Ref<anurbs::NurbsSurfaceGeometry<3L>_> local_310;
  __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_300;
  Pointer<anurbs::NurbsSurfaceGeometry<3L>_> *surface_3d_a;
  element_type *local_2e8;
  Ref<anurbs::BrepFace> *face_b;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d0;
  Ref<anurbs::BrepFace> *face_a;
  undefined8 local_2c0;
  Interval local_2b8;
  element_type *local_2a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2a0;
  double t_b;
  Vector point;
  double t_a;
  Interval span_a;
  __normal_iterator<anurbs::Interval_*,_std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>_>
  local_260;
  iterator __end2_1;
  iterator __begin2_1;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *__range2_1;
  undefined1 auStack_228 [8];
  Interval span_b;
  __normal_iterator<anurbs::Interval_*,_std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>_>
  local_210;
  iterator __end2;
  iterator __begin2;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *__range2;
  vector<double,_std::allocator<double>_> spans_on_curve_b;
  undefined1 local_1b8 [8];
  PointOnCurveProjection<3L> projection_b;
  undefined1 local_130 [8];
  PointOnCurveProjection<3L> projection_a;
  Pointer<CurveOnSurface<3>_> curve_3d_b;
  Pointer<CurveOnSurface<3>_> curve_3d_a;
  BrepTrim *trim_b;
  BrepEdge local_70;
  BrepTrim *trim_a;
  IntegrationPointList<1> integration_points_b;
  IntegrationPointList<1> integration_points_a;
  double tessellation_tolerance_local;
  double tolerance_local;
  BrepEdge *edge_local;
  
  std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::vector
            ((vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> *)
             &integration_points_b.
              super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::vector
            ((vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> *)
             &trim_a);
  BrepEdge::trim(&local_70,(size_t)edge);
  pBVar5 = Ref<anurbs::BrepTrim>::operator*((Ref<anurbs::BrepTrim> *)&local_70);
  Ref<anurbs::BrepTrim>::~Ref((Ref<anurbs::BrepTrim> *)&local_70);
  this = &curve_3d_a.
          super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
  local_70.m_trims.
  super__Vector_base<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pBVar5;
  BrepEdge::trim((BrepEdge *)this,(size_t)edge);
  Ref<anurbs::BrepTrim>::operator*((Ref<anurbs::BrepTrim> *)this);
  Ref<anurbs::BrepTrim>::~Ref
            ((Ref<anurbs::BrepTrim> *)
             &curve_3d_a.
              super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  BrepTrim::curve_3d((BrepTrim *)
                     &curve_3d_b.
                      super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  BrepTrim::curve_3d((BrepTrim *)&projection_a.mapper);
  std::shared_ptr<anurbs::CurveBase<3l>>::
  shared_ptr<anurbs::CurveOnSurface<3l,std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>,void>
            ((shared_ptr<anurbs::CurveBase<3l>> *)&projection_b.mapper,
             (shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>_>
              *)&curve_3d_b.
                 super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount);
  PointOnCurveProjection<3L>::PointOnCurveProjection
            ((PointOnCurveProjection<3L> *)local_130,
             (Pointer<CurveBaseD>_conflict *)&projection_b.mapper,tolerance,tessellation_tolerance);
  std::shared_ptr<anurbs::CurveBase<3L>_>::~shared_ptr
            ((shared_ptr<anurbs::CurveBase<3L>_> *)&projection_b.mapper);
  this_00 = &spans_on_curve_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::shared_ptr<anurbs::CurveBase<3l>>::
  shared_ptr<anurbs::CurveOnSurface<3l,std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>,void>
            ((shared_ptr<anurbs::CurveBase<3l>> *)this_00,
             (shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>_>
              *)&projection_a.mapper);
  PointOnCurveProjection<3L>::PointOnCurveProjection
            ((PointOnCurveProjection<3L> *)local_1b8,(Pointer<CurveBaseD>_conflict *)this_00,
             tolerance,tessellation_tolerance);
  std::shared_ptr<anurbs::CurveBase<3L>_>::~shared_ptr
            ((shared_ptr<anurbs::CurveBase<3L>_> *)
             &spans_on_curve_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&__range2);
  peVar6 = std::
           __shared_ptr_access<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&projection_a.mapper);
  (*(peVar6->super_CurveBase<3L>)._vptr_CurveBase[4])(&__begin2);
  __end2 = std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::begin
                     ((vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&__begin2);
  local_210._M_current =
       (Interval *)
       std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::end
                 ((vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&__begin2);
  while (bVar3 = __gnu_cxx::operator!=(&__end2,&local_210), bVar3) {
    pIVar7 = __gnu_cxx::
             __normal_iterator<anurbs::Interval_*,_std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>_>
             ::operator*(&__end2);
    auStack_228 = (undefined1  [8])pIVar7->m_t0;
    span_b.m_t0 = pIVar7->m_t1;
    __range2_1 = (vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)
                 Interval::t0((Interval *)auStack_228);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)&__range2,(double *)&__range2_1);
    __gnu_cxx::
    __normal_iterator<anurbs::Interval_*,_std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>_>
    ::operator++(&__end2);
  }
  std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::~vector
            ((vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&__begin2);
  peVar6 = std::
           __shared_ptr_access<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&curve_3d_b.
                            super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  (*(peVar6->super_CurveBase<3L>)._vptr_CurveBase[4])(&__begin2_1);
  __end2_1 = std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::begin
                       ((vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&__begin2_1);
  local_260._M_current =
       (Interval *)
       std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::end
                 ((vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&__begin2_1);
  while (bVar3 = __gnu_cxx::operator!=(&__end2_1,&local_260), bVar3) {
    pIVar7 = __gnu_cxx::
             __normal_iterator<anurbs::Interval_*,_std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>_>
             ::operator*(&__end2_1);
    t_a = pIVar7->m_t0;
    span_a.m_t0 = pIVar7->m_t1;
    point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
         Interval::t0((Interval *)&t_a);
    peVar6 = std::
             __shared_ptr_access<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&curve_3d_b.
                              super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    (*(peVar6->super_CurveBase<3L>)._vptr_CurveBase[5])
              (SUB84(point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                     m_data.array[2],0),&t_b);
    PointOnCurveProjection<3L>::compute((PointOnCurveProjection<3L> *)local_1b8,(Vector *)&t_b,0.0);
    local_2a0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         PointOnCurveProjection<3L>::parameter((PointOnCurveProjection<3L> *)local_1b8);
    std::vector<double,std::allocator<double>>::emplace_back<double_const&>
              ((vector<double,std::allocator<double>> *)&__range2,(double *)&local_2a0);
    __gnu_cxx::
    __normal_iterator<anurbs::Interval_*,_std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>_>
    ::operator++(&__end2_1);
  }
  std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::~vector
            ((vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *)&__begin2_1);
  peVar6 = std::
           __shared_ptr_access<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&projection_a.mapper);
  (*(peVar6->super_CurveBase<3L>)._vptr_CurveBase[3])();
  local_2b8.m_t1 = tessellation_tolerance;
  local_2a8 = (element_type *)Interval::t1(&local_2b8);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((vector<double,_std::allocator<double>_> *)&__range2,(double *)&local_2a8);
  local_2c0 = std::vector<double,_std::allocator<double>_>::begin
                        ((vector<double,_std::allocator<double>_> *)&__range2);
  face_a = (Ref<anurbs::BrepFace> *)
           std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)&__range2);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)local_2c0,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)face_a);
  BrepTrim::face((BrepTrim *)&face_b);
  local_2d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&face_b;
  BrepTrim::face((BrepTrim *)&surface_3d_a);
  local_2e8 = (element_type *)&surface_3d_a;
  Ref<anurbs::BrepFace>::operator->((Ref<anurbs::BrepFace> *)&surface_3d_b);
  std::__shared_ptr_access<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &surface_3d_b);
  BrepFace::surface_geometry((BrepFace *)local_320);
  Ref<anurbs::NurbsSurfaceGeometry<3L>_>::data(&local_310);
  Ref<anurbs::NurbsSurfaceGeometry<3L>_>::~Ref((Ref<anurbs::NurbsSurfaceGeometry<3L>_> *)local_320);
  std::shared_ptr<anurbs::BrepFace>::~shared_ptr((shared_ptr<anurbs::BrepFace> *)&surface_3d_b);
  local_300 = (__shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)&local_310;
  Ref<anurbs::BrepFace>::operator->((Ref<anurbs::BrepFace> *)&degree);
  std::__shared_ptr_access<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &degree);
  BrepFace::surface_geometry((BrepFace *)local_358);
  Ref<anurbs::NurbsSurfaceGeometry<3L>_>::data(&local_348);
  Ref<anurbs::NurbsSurfaceGeometry<3L>_>::~Ref((Ref<anurbs::NurbsSurfaceGeometry<3L>_> *)local_358);
  std::shared_ptr<anurbs::BrepFace>::~shared_ptr((shared_ptr<anurbs::BrepFace> *)&degree);
  local_338 = (__shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)&local_348;
  peVar8 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_300);
  iVar4 = (*(peVar8->super_SurfaceBase<3L>)._vptr_SurfaceBase[2])();
  nb_integration_points = CONCAT44(extraout_var,iVar4);
  peVar8 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_300);
  iVar4 = (*(peVar8->super_SurfaceBase<3L>)._vptr_SurfaceBase[3])();
  local_398 = CONCAT44(extraout_var_00,iVar4);
  peVar8 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_338);
  iVar4 = (*(peVar8->super_SurfaceBase<3L>)._vptr_SurfaceBase[2])();
  local_390 = CONCAT44(extraout_var_01,iVar4);
  peVar8 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_338);
  iVar4 = (*(peVar8->super_SurfaceBase<3L>)._vptr_SurfaceBase[3])();
  local_388 = CONCAT44(extraout_var_02,iVar4);
  local_380 = &nb_integration_points;
  local_378 = 4;
  __l._M_len = 4;
  __l._M_array = local_380;
  lVar9 = std::max<long>(__l);
  local_370 = lVar9 + 1;
  IVar10 = length<std::vector<double,std::allocator<double>>>
                     ((vector<double,_std::allocator<double>_> *)&__range2);
  __n = (IVar10 + -1) * (local_370 + 1);
  std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::reserve
            ((vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> *)
             &integration_points_b.
              super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__n);
  std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::reserve
            ((vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> *)
             &trim_a,__n);
  for (t0_b = 4.94065645841247e-324;
      IVar10 = length<std::vector<double,std::allocator<double>>>
                         ((vector<double,_std::allocator<double>_> *)&__range2), (long)t0_b < IVar10
      ; t0_b = (value_type)((long)t0_b + 1)) {
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)&__range2,(long)t0_b - 1);
    dVar1 = *pvVar11;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)&__range2,(size_type)t0_b);
    Interval::Interval((Interval *)
                       &points.
                        super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,dVar1,*pvVar11);
    dVar1 = Interval::length((Interval *)
                             &points.
                              super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (1e-07 <= dVar1) {
      IntegrationPoints::get
                ((IntegrationPointList<1> *)&__range3,local_370,
                 (Interval *)
                 &points.
                  super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __end3 = std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
               ::begin((vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                        *)&__range3);
      local_400._M_current =
           (tuple<double,_double> *)
           std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::
           end((vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> *)
               &__range3);
      while (bVar3 = __gnu_cxx::operator!=(&__end3,&local_400), bVar3) {
        __t = __gnu_cxx::
              __normal_iterator<const_std::tuple<double,_double>_*,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
              ::operator*(&__end3);
        __args = std::get<0ul,double,double>(__t);
        p_Var12 = std::get<1ul,double,double>(__t);
        peVar6 = std::
                 __shared_ptr_access<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&projection_a.mapper);
        (*(peVar6->super_CurveBase<3L>)._vptr_CurveBase[6])
                  (SUB84(*__args,0),
                   tangent.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                   m_data.array + 2,peVar6,1);
        pvVar13 = std::
                  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                                *)(tangent.
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                   m_storage.m_data.array + 2),1);
        Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
                  ((Matrix<double,_1,_3,_1,_1,_3> *)&weight,pvVar13);
        dVar1 = *p_Var12;
        dVar2 = norm((Vector<3> *)&weight);
        t_a_1 = dVar1 * dVar2;
        std::vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>::
        emplace_back<double_const&,double_const&>
                  ((vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>> *)
                   &trim_a,__args,&t_a_1);
        pvVar13 = std::
                  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                                *)(tangent.
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                   m_storage.m_data.array + 2),0);
        PointOnCurveProjection<3L>::compute((PointOnCurveProjection<3L> *)local_130,pvVar13,0.0);
        local_458 = PointOnCurveProjection<3L>::parameter((PointOnCurveProjection<3L> *)local_130);
        std::vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>>::
        emplace_back<double_const&,double_const&>
                  ((vector<std::tuple<double,double>,std::allocator<std::tuple<double,double>>> *)
                   &integration_points_b.
                    super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_458,&t_a_1);
        std::
        vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
        ::~vector((vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                   *)(tangent.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
                      .m_data.array + 2));
        __gnu_cxx::
        __normal_iterator<const_std::tuple<double,_double>_*,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
        ::operator++(&__end3);
      }
      std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::~vector
                ((vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> *
                 )&__range3);
    }
  }
  std::
  pair<std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
  ::
  pair<std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_&,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_&,_true>
            (__return_storage_ptr__,
             (vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> *)
             &integration_points_b.
              super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> *)
             &trim_a);
  std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>::~shared_ptr
            ((shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_> *)&local_348);
  std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>::~shared_ptr
            ((shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_> *)&local_310);
  Ref<anurbs::BrepFace>::~Ref((Ref<anurbs::BrepFace> *)&surface_3d_a);
  Ref<anurbs::BrepFace>::~Ref((Ref<anurbs::BrepFace> *)&face_b);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&__range2);
  PointOnCurveProjection<3L>::~PointOnCurveProjection((PointOnCurveProjection<3L> *)local_1b8);
  PointOnCurveProjection<3L>::~PointOnCurveProjection((PointOnCurveProjection<3L> *)local_130);
  std::
  shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>_>
  ::~shared_ptr((shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>_>
                 *)&projection_a.mapper);
  std::
  shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>_>
  ::~shared_ptr((shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>_>
                 *)&curve_3d_b.
                    super___shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::~vector
            ((vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> *)
             &trim_a);
  std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::~vector
            ((vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> *)
             &integration_points_b.
              super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

static std::pair<IntegrationPointList<1>, IntegrationPointList<1>> get(const BrepEdge& edge, const double tolerance, const double tessellation_tolerance)
    {
        IntegrationPointList<1> integration_points_a;
        IntegrationPointList<1> integration_points_b;

        // FIXME: check nb_trims == 2

        const auto& trim_a = *edge.trim(0);
        const auto& trim_b = *edge.trim(1);

        const auto curve_3d_a = trim_a.curve_3d();
        const auto curve_3d_b = trim_b.curve_3d();

        PointOnCurveProjection<3> projection_a(curve_3d_a, tolerance, tessellation_tolerance);
        PointOnCurveProjection<3> projection_b(curve_3d_b, tolerance, tessellation_tolerance);

        std::vector<double> spans_on_curve_b;

        for (const auto span_b : curve_3d_b->spans()) {
            spans_on_curve_b.emplace_back(span_b.t0());
        }

        for (const auto span_a : curve_3d_a->spans()) {
            const double t_a = span_a.t0();

            const Vector point = curve_3d_a->point_at(t_a);

            projection_b.compute(point);

            const double t_b = projection_b.parameter();

            spans_on_curve_b.emplace_back(t_b);
        }

        spans_on_curve_b.emplace_back(curve_3d_b->domain().t1());

        std::sort(spans_on_curve_b.begin(), spans_on_curve_b.end());

        const auto& face_a = trim_a.face();
        const auto& face_b = trim_b.face();

        const auto& surface_3d_a = face_a->surface_geometry().data();
        const auto& surface_3d_b = face_b->surface_geometry().data();

        const auto degree = std::max({surface_3d_a->degree_u(),
                                surface_3d_a->degree_v(), surface_3d_b->degree_u(),
                                surface_3d_b->degree_v()})
            + 1;

        const auto nb_integration_points = (length(spans_on_curve_b) - 1) * (degree + 1);

        integration_points_a.reserve(nb_integration_points);
        integration_points_b.reserve(nb_integration_points);

        for (Index i = 1; i < length(spans_on_curve_b); i++) {
            const auto t0_b = spans_on_curve_b[i - 1];
            const auto t1_b = spans_on_curve_b[i];

            const Interval span_b(t0_b, t1_b);

            if (span_b.length() < 1e-7) {
                continue;
            }

            const auto points = IntegrationPoints::get(degree, span_b);

            for (const auto& [t_b, weight_b] : points) {
                const auto ders = curve_3d_b->derivatives_at(t_b, 1);

                const auto tangent = ders[1];
                const auto weight = weight_b * norm(tangent);

                integration_points_b.emplace_back(t_b, weight);

                projection_a.compute(ders[0]);

                const auto t_a = projection_a.parameter();

                integration_points_a.emplace_back(t_a, weight);
            }
        }

        return {integration_points_a, integration_points_b};
    }